

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MeshDenoisingBase.cpp
# Opt level: O0

double __thiscall
MeshDenoisingBase::getMeanSquareAngleError
          (MeshDenoisingBase *this,TriMesh *DenoisedMesh,TriMesh *OriginalMesh)

{
  bool bVar1;
  reference pvVar2;
  Normal *pNVar3;
  double *pdVar4;
  undefined8 uVar5;
  double dVar6;
  undefined1 auVar7 [16];
  double local_b0;
  double local_a8;
  double local_a0;
  double cross_value;
  undefined1 local_90 [8];
  Normal normal2;
  undefined1 local_70 [8];
  Normal normal1;
  undefined1 local_48 [8];
  FaceIter f_it2;
  FaceIter f_it1;
  double mean_square_angle_error;
  TriMesh *OriginalMesh_local;
  TriMesh *DenoisedMesh_local;
  MeshDenoisingBase *this_local;
  
  OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>::
  request_face_normals
            ((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity> *)
             DenoisedMesh);
  OpenMesh::
  PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
  ::update_face_normals
            ((PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
              *)DenoisedMesh);
  OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>::
  request_face_normals
            ((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity> *)
             OriginalMesh);
  OpenMesh::
  PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
  ::update_face_normals
            ((PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
              *)OriginalMesh);
  f_it1.hnd_.super_BaseHandle.idx_ = (BaseHandle)0x0;
  f_it1.skip_bits_ = 0;
  join_0x00000010_0x00000000_ =
       OpenMesh::PolyConnectivity::faces_begin((PolyConnectivity *)DenoisedMesh);
  _local_48 = OpenMesh::PolyConnectivity::faces_begin((PolyConnectivity *)OriginalMesh);
  while( true ) {
    join_0x00000010_0x00000000_ =
         OpenMesh::PolyConnectivity::faces_end((PolyConnectivity *)DenoisedMesh);
    bVar1 = OpenMesh::Iterators::
            GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
            ::operator!=((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                          *)&f_it2.hnd_,
                         (GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                          *)(normal1.super_VectorDataT<double,_3>.values_ + 2));
    if (!bVar1) break;
    pvVar2 = OpenMesh::Iterators::
             GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
             ::operator*((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                          *)&f_it2.hnd_);
    normal2.super_VectorDataT<double,_3>.values_[2]._4_4_ = (pvVar2->super_BaseHandle).idx_;
    pNVar3 = OpenMesh::
             AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>::
             normal((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                     *)DenoisedMesh,
                    (FaceHandle)normal2.super_VectorDataT<double,_3>.values_[2]._4_4_);
    local_70 = (undefined1  [8])(pNVar3->super_VectorDataT<double,_3>).values_[0];
    normal1.super_VectorDataT<double,_3>.values_[0] =
         (pNVar3->super_VectorDataT<double,_3>).values_[1];
    normal1.super_VectorDataT<double,_3>.values_[1] =
         (pNVar3->super_VectorDataT<double,_3>).values_[2];
    pvVar2 = OpenMesh::Iterators::
             GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
             ::operator*((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                          *)local_48);
    cross_value._4_4_ = (pvVar2->super_BaseHandle).idx_;
    pNVar3 = OpenMesh::
             AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>::
             normal((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                     *)OriginalMesh,(FaceHandle)cross_value._4_4_);
    local_90 = (undefined1  [8])(pNVar3->super_VectorDataT<double,_3>).values_[0];
    normal2.super_VectorDataT<double,_3>.values_[0] =
         (pNVar3->super_VectorDataT<double,_3>).values_[1];
    normal2.super_VectorDataT<double,_3>.values_[1] =
         (pNVar3->super_VectorDataT<double,_3>).values_[2];
    local_a0 = OpenMesh::VectorT<double,_3>::operator|
                         ((VectorT<double,_3> *)local_70,(vector_type *)local_90);
    local_a8 = 1.0;
    local_b0 = -1.0;
    pdVar4 = std::max<double>(&local_a0,&local_b0);
    pdVar4 = std::min<double>(&local_a8,pdVar4);
    local_a0 = *pdVar4;
    dVar6 = acos(local_a0);
    f_it1._8_8_ = (dVar6 * 180.0) / 3.141592653589793 + (double)f_it1._8_8_;
    OpenMesh::Iterators::
    GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
    ::operator++((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                  *)&f_it2.hnd_,0);
    OpenMesh::Iterators::
    GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
    ::operator++((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                  *)local_48,0);
  }
  uVar5 = (**(code **)(*(long *)&(DenoisedMesh->super_Mesh).
                                 super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                 .
                                 super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                      + 0x28))();
  auVar7._8_4_ = (int)((ulong)uVar5 >> 0x20);
  auVar7._0_8_ = uVar5;
  auVar7._12_4_ = 0x45300000;
  return (double)f_it1._8_8_ /
         ((auVar7._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0));
}

Assistant:

double MeshDenoisingBase::getMeanSquareAngleError(TriMesh &DenoisedMesh, TriMesh &OriginalMesh)
{
    DenoisedMesh.request_face_normals();
    DenoisedMesh.update_face_normals();

    OriginalMesh.request_face_normals();
    OriginalMesh.update_face_normals();

    double mean_square_angle_error = 0.0;
    for (TriMesh::FaceIter f_it1 = DenoisedMesh.faces_begin(), f_it2 = OriginalMesh.faces_begin();
        f_it1 != DenoisedMesh.faces_end(); f_it1++, f_it2++ )
    {
        TriMesh::Normal normal1 = DenoisedMesh.normal(*f_it1);
        TriMesh::Normal normal2 = OriginalMesh.normal(*f_it2);
        double cross_value = normal1 | normal2;
        cross_value = std::min(1.0, std::max(cross_value, -1.0));
        mean_square_angle_error += std::acos(cross_value) * 180.0 / M_PI;
    }

    return mean_square_angle_error / (double)DenoisedMesh.n_faces();
}